

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int rar_br_fillup(archive_read *a,rar_br *br)

{
  void *pvVar1;
  byte *pbVar2;
  uchar *puVar3;
  int local_2c;
  int n;
  rar *rar;
  rar_br *br_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  local_2c = 0x40 - br->cache_avail;
  do {
    switch(local_2c >> 3) {
    case 0:
      return 1;
    default:
      break;
    case 6:
      if (5 < br->avail_in) {
        br->cache_buffer =
             br->cache_buffer << 0x30 | (ulong)*br->next_in << 0x28 | (ulong)br->next_in[1] << 0x20
             | (ulong)br->next_in[2] << 0x18 | (ulong)br->next_in[3] << 0x10 |
             (ulong)br->next_in[4] << 8 | (ulong)br->next_in[5];
        br->next_in = br->next_in + 6;
        br->avail_in = br->avail_in + -6;
        br->cache_avail = br->cache_avail + 0x30;
        *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 6;
        *(long *)((long)pvVar1 + 0xa8) = *(long *)((long)pvVar1 + 0xa8) + -6;
        return 1;
      }
      break;
    case 7:
      if (6 < br->avail_in) {
        br->cache_buffer =
             br->cache_buffer << 0x38 | (ulong)*br->next_in << 0x30 | (ulong)br->next_in[1] << 0x28
             | (ulong)br->next_in[2] << 0x20 | (ulong)br->next_in[3] << 0x18 |
             (ulong)br->next_in[4] << 0x10 | (ulong)br->next_in[5] << 8 | (ulong)br->next_in[6];
        br->next_in = br->next_in + 7;
        br->avail_in = br->avail_in + -7;
        br->cache_avail = br->cache_avail + 0x38;
        *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 7;
        *(long *)((long)pvVar1 + 0xa8) = *(long *)((long)pvVar1 + 0xa8) + -7;
        return 1;
      }
      break;
    case 8:
      if (7 < br->avail_in) {
        br->cache_buffer =
             (ulong)*br->next_in << 0x38 | (ulong)br->next_in[1] << 0x30 |
             (ulong)br->next_in[2] << 0x28 | (ulong)br->next_in[3] << 0x20 |
             (ulong)br->next_in[4] << 0x18 | (ulong)br->next_in[5] << 0x10 |
             (ulong)br->next_in[6] << 8 | (ulong)br->next_in[7];
        br->next_in = br->next_in + 8;
        br->avail_in = br->avail_in + -8;
        br->cache_avail = br->cache_avail + 0x40;
        *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 8;
        *(long *)((long)pvVar1 + 0xa8) = *(long *)((long)pvVar1 + 0xa8) + -8;
        return 1;
      }
    }
    if (br->avail_in < 1) {
      if (0 < *(long *)((long)pvVar1 + 0xa0)) {
        __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0xa0));
        *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
      }
      puVar3 = (uchar *)rar_read_ahead(a,1,&br->avail_in);
      br->next_in = puVar3;
      if (br->next_in == (uchar *)0x0) {
        return 0;
      }
      if (br->avail_in == 0) {
        return 0;
      }
    }
    pbVar2 = br->next_in;
    br->next_in = pbVar2 + 1;
    br->cache_buffer = br->cache_buffer << 8 | (ulong)*pbVar2;
    br->avail_in = br->avail_in + -1;
    br->cache_avail = br->cache_avail + 8;
    local_2c = local_2c + -8;
    *(long *)((long)pvVar1 + 0xa0) = *(long *)((long)pvVar1 + 0xa0) + 1;
    *(long *)((long)pvVar1 + 0xa8) = *(long *)((long)pvVar1 + 0xa8) + -1;
  } while( true );
}

Assistant:

static int
rar_br_fillup(struct archive_read *a, struct rar_br *br)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int n = CACHE_BITS - br->cache_avail;

  for (;;) {
    switch (n >> 3) {
    case 8:
      if (br->avail_in >= 8) {
        br->cache_buffer =
            ((uint64_t)br->next_in[0]) << 56 |
            ((uint64_t)br->next_in[1]) << 48 |
            ((uint64_t)br->next_in[2]) << 40 |
            ((uint64_t)br->next_in[3]) << 32 |
            ((uint32_t)br->next_in[4]) << 24 |
            ((uint32_t)br->next_in[5]) << 16 |
            ((uint32_t)br->next_in[6]) << 8 |
             (uint32_t)br->next_in[7];
        br->next_in += 8;
        br->avail_in -= 8;
        br->cache_avail += 8 * 8;
        rar->bytes_unconsumed += 8;
        rar->bytes_remaining -= 8;
        return (1);
      }
      break;
    case 7:
      if (br->avail_in >= 7) {
        br->cache_buffer =
           (br->cache_buffer << 56) |
            ((uint64_t)br->next_in[0]) << 48 |
            ((uint64_t)br->next_in[1]) << 40 |
            ((uint64_t)br->next_in[2]) << 32 |
            ((uint32_t)br->next_in[3]) << 24 |
            ((uint32_t)br->next_in[4]) << 16 |
            ((uint32_t)br->next_in[5]) << 8 |
             (uint32_t)br->next_in[6];
        br->next_in += 7;
        br->avail_in -= 7;
        br->cache_avail += 7 * 8;
        rar->bytes_unconsumed += 7;
        rar->bytes_remaining -= 7;
        return (1);
      }
      break;
    case 6:
      if (br->avail_in >= 6) {
        br->cache_buffer =
           (br->cache_buffer << 48) |
            ((uint64_t)br->next_in[0]) << 40 |
            ((uint64_t)br->next_in[1]) << 32 |
            ((uint32_t)br->next_in[2]) << 24 |
            ((uint32_t)br->next_in[3]) << 16 |
            ((uint32_t)br->next_in[4]) << 8 |
             (uint32_t)br->next_in[5];
        br->next_in += 6;
        br->avail_in -= 6;
        br->cache_avail += 6 * 8;
        rar->bytes_unconsumed += 6;
        rar->bytes_remaining -= 6;
        return (1);
      }
      break;
    case 0:
      /* We have enough compressed data in
       * the cache buffer.*/
      return (1);
    default:
      break;
    }
    if (br->avail_in <= 0) {

      if (rar->bytes_unconsumed > 0) {
        /* Consume as much as the decompressor
         * actually used. */
        __archive_read_consume(a, rar->bytes_unconsumed);
        rar->bytes_unconsumed = 0;
      }
      br->next_in = rar_read_ahead(a, 1, &(br->avail_in));
      if (br->next_in == NULL)
        return (0);
      if (br->avail_in == 0)
        return (0);
    }
    br->cache_buffer =
       (br->cache_buffer << 8) | *br->next_in++;
    br->avail_in--;
    br->cache_avail += 8;
    n -= 8;
    rar->bytes_unconsumed++;
    rar->bytes_remaining--;
  }
}